

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O1

int32_t uscript_getScriptExtensions_63
                  (UChar32 c,UScriptCode *scripts,int32_t capacity,UErrorCode *pErrorCode)

{
  ushort uVar1;
  int32_t iVar2;
  UScriptCode UVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  UScriptCode UVar7;
  
  uVar5 = 0;
  iVar2 = 0;
  if (pErrorCode != (UErrorCode *)0x0) {
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((capacity < 0) || (scripts == (UScriptCode *)0x0 && capacity != 0)) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        UVar3 = u_getUnicodeProperties_63(c,0);
        UVar7 = UVar3 & 0xc000ff;
        if ((uint)UVar7 < 0x400000) {
          if (capacity == 0) {
            *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
          }
          else {
            *scripts = UVar7;
          }
          uVar5 = 1;
        }
        else {
          uVar6 = (ulong)(uint)(UVar3 & (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_TAI_VIET));
          if (0xbfffff < (uint)UVar7) {
            uVar6 = (ulong)scriptExtensions[uVar6 + 1];
          }
          uVar5 = 0;
          do {
            uVar4 = uVar5;
            uVar1 = scriptExtensions[uVar6 + uVar4];
            if (uVar4 < (uint)capacity) {
              scripts[uVar4] = (uint)uVar1 & 0x7fff;
            }
            uVar5 = uVar4 + 1;
          } while (-1 < (short)uVar1);
          if ((uint)capacity <= uVar4) {
            *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
          }
        }
      }
    }
    iVar2 = (int32_t)uVar5;
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uscript_getScriptExtensions(UChar32 c,
                            UScriptCode *scripts, int32_t capacity,
                            UErrorCode *pErrorCode) {
    uint32_t scriptX;
    int32_t length;
    const uint16_t *scx;
    uint16_t sx;
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(capacity<0 || (capacity>0 && scripts==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    scriptX=u_getUnicodeProperties(c, 0)&UPROPS_SCRIPT_X_MASK;
    if(scriptX<UPROPS_SCRIPT_X_WITH_COMMON) {
        if(capacity==0) {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        } else {
            scripts[0]=(UScriptCode)scriptX;
        }
        return 1;
    }

    scx=scriptExtensions+(scriptX&UPROPS_SCRIPT_MASK);
    if(scriptX>=UPROPS_SCRIPT_X_WITH_OTHER) {
        scx=scriptExtensions+scx[1];
    }
    length=0;
    do {
        sx=*scx++;
        if(length<capacity) {
            scripts[length]=(UScriptCode)(sx&0x7fff);
        }
        ++length;
    } while(sx<0x8000);
    if(length>capacity) {
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
    return length;
}